

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O2

QJsonObject qvariant_cast<QJsonObject>(QVariant *v)

{
  QCborContainerPrivate *pQVar1;
  QCborContainerPrivate *pQVar2;
  bool bVar3;
  QJsonObject *in_RSI;
  long in_FS_OFFSET;
  QMetaType local_28;
  QMetaType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QJsonObject>::metaType;
  local_28.d_ptr = (QMetaTypeInterface *)((ulong)in_RSI[3].o.d.ptr & 0xfffffffffffffffc);
  bVar3 = comparesEqual(&local_28,&local_20);
  if (bVar3) {
    if (((ulong)in_RSI[3].o.d.ptr & 1) != 0) {
      pQVar1 = (in_RSI->o).d.ptr;
      in_RSI = (QJsonObject *)
               ((long)&(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value + (long)*(int *)&pQVar1->field_0x4);
    }
    QJsonObject::QJsonObject((QJsonObject *)v,in_RSI);
  }
  else {
    (v->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)v);
    pQVar1 = in_RSI[3].o.d.ptr;
    if (((ulong)pQVar1 & 1) != 0) {
      pQVar2 = (in_RSI->o).d.ptr;
      in_RSI = (QJsonObject *)
               ((long)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value + (long)*(int *)&pQVar2->field_0x4);
    }
    QMetaType::convert((QMetaTypeInterface *)((ulong)pQVar1 & 0xfffffffffffffffc),in_RSI,local_20,v)
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)v;
  }
  __stack_chk_fail();
}

Assistant:

inline T qvariant_cast(const QVariant &v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType)
        return v.d.get<T>();
    if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}